

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Buffer.cxx
# Opt level: O2

void __thiscall
Fl_Text_Buffer::add_predelete_callback
          (Fl_Text_Buffer *this,Fl_Text_Predelete_Cb bufPreDeleteCB,void *cbArg)

{
  uint uVar1;
  Fl_Text_Predelete_Cb *pp_Var2;
  Fl_Text_Predelete_Cb *pp_Var3;
  void **ppvVar4;
  ulong uVar5;
  ulong uVar6;
  void **ppvVar7;
  
  uVar1 = this->mNPredeleteProcs;
  uVar5 = 0xffffffffffffffff;
  if (-2 < (long)(int)uVar1) {
    uVar5 = (long)(int)uVar1 * 8 + 8;
  }
  pp_Var3 = (Fl_Text_Predelete_Cb *)operator_new__(uVar5);
  ppvVar4 = (void **)operator_new__(uVar5);
  pp_Var2 = this->mPredeleteProcs;
  ppvVar7 = this->mPredeleteCbArgs;
  uVar5 = 0;
  uVar6 = 0;
  if (0 < (int)uVar1) {
    uVar6 = (ulong)uVar1;
  }
  for (; uVar6 != uVar5; uVar5 = uVar5 + 1) {
    pp_Var3[uVar5 + 1] = pp_Var2[uVar5];
    ppvVar4[uVar5 + 1] = ppvVar7[uVar5];
  }
  if (0 < (int)uVar1) {
    if (pp_Var2 != (Fl_Text_Predelete_Cb *)0x0) {
      operator_delete__(pp_Var2);
      ppvVar7 = this->mPredeleteCbArgs;
    }
    if (ppvVar7 != (void **)0x0) {
      operator_delete__(ppvVar7);
    }
  }
  *pp_Var3 = bufPreDeleteCB;
  *ppvVar4 = cbArg;
  this->mNPredeleteProcs = this->mNPredeleteProcs + 1;
  this->mPredeleteProcs = pp_Var3;
  this->mPredeleteCbArgs = ppvVar4;
  return;
}

Assistant:

void Fl_Text_Buffer::add_predelete_callback(Fl_Text_Predelete_Cb bufPreDeleteCB, 
                                            void *cbArg)
{
  Fl_Text_Predelete_Cb *newPreDeleteProcs =
  new Fl_Text_Predelete_Cb[mNPredeleteProcs + 1];
  void **newCBArgs = new void *[mNPredeleteProcs + 1];
  for (int i = 0; i < mNPredeleteProcs; i++) {
    newPreDeleteProcs[i + 1] = mPredeleteProcs[i];
    newCBArgs[i + 1] = mPredeleteCbArgs[i];
  }
  if (mNPredeleteProcs > 0) {
    delete[] mPredeleteProcs;
    delete[] mPredeleteCbArgs;
  }
  newPreDeleteProcs[0] = bufPreDeleteCB;
  newCBArgs[0] = cbArg;
  mNPredeleteProcs++;
  mPredeleteProcs = newPreDeleteProcs;
  mPredeleteCbArgs = newCBArgs;
}